

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
          *this,size_t n)

{
  bool bVar1;
  memory_resource *pmVar2;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  long lVar7;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar5;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 0x18 == 0) {
    poVar5 = (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)0x0;
  }
  else {
    pmVar2 = (this->alloc).memoryResource;
    iVar4 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,n * 0x18,8);
    poVar5 = (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)CONCAT44(extraout_var,iVar4);
  }
  poVar3 = this->ptr;
  sVar6 = this->nStored;
  if (sVar6 == 0) {
    if (poVar3 == (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)0x0) goto LAB_00423d85;
  }
  else {
    lVar7 = 0;
    do {
      bVar1 = (&poVar3->set)[lVar7];
      (&poVar5->set)[lVar7] = bVar1;
      if (bVar1 == true) {
        *(undefined8 *)((long)&poVar5->optionalValue + lVar7) = 0;
        *(undefined8 *)((long)&poVar5->optionalValue + lVar7) =
             *(undefined8 *)((long)&poVar3->optionalValue + lVar7);
        *(undefined4 *)((long)&poVar5->optionalValue + lVar7 + 8) =
             *(undefined4 *)((long)&poVar3->optionalValue + lVar7 + 8);
LAB_00423d56:
        (&poVar3->set)[lVar7] = false;
      }
      else if (bVar1 != false) goto LAB_00423d56;
      lVar7 = lVar7 + 0x18;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  pmVar2 = (this->alloc).memoryResource;
  (*pmVar2->_vptr_memory_resource[3])(pmVar2,poVar3,this->nAlloc * 0x18,8);
LAB_00423d85:
  this->nAlloc = n;
  this->ptr = poVar5;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }